

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

bool __thiscall
pbrt::BasicTextureEvaluator::CanEvaluate
          (BasicTextureEvaluator *this,initializer_list<pbrt::FloatTextureHandle> ftex,
          initializer_list<pbrt::SpectrumTextureHandle> stex)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = ftex._M_len == 0;
  if (!bVar4) {
    lVar2 = 0;
    do {
      uVar3 = *(ulong *)((long)&((ftex._M_array)->
                                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                                ).bits + lVar2);
      if ((((uVar3 & 0xffffffffffff) != 0) &&
          (uVar3 = uVar3 & 0xffff000000000000, uVar3 != 0x5000000000000)) &&
         (uVar3 != 0x2000000000000)) {
        if (!bVar4) {
          return false;
        }
        break;
      }
      lVar2 = lVar2 + 8;
      bVar4 = ftex._M_len * 8 == lVar2;
    } while (!bVar4);
  }
  bVar4 = stex._M_len == 0;
  if (!bVar4) {
    lVar2 = 0;
    do {
      uVar3 = *(ulong *)((long)&((stex._M_array)->
                                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                                ).bits + lVar2);
      if ((uVar3 & 0xffffffffffff) != 0) {
        uVar1 = (ushort)(uVar3 - 0x1000000000000 >> 0x30);
        if (6 < uVar1) {
          return bVar4;
        }
        if ((0x4bU >> (uVar1 & 0x1f) & 1) == 0) {
          return bVar4;
        }
      }
      lVar2 = lVar2 + 8;
      bVar4 = stex._M_len * 8 == lVar2;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

PBRT_CPU_GPU
    bool CanEvaluate(std::initializer_list<FloatTextureHandle> ftex,
                     std::initializer_list<SpectrumTextureHandle> stex) const {
        for (auto f : ftex)
            if (f && (!f.Is<FloatConstantTexture>() && !f.Is<GPUFloatImageTexture>())) {
                return false;
            }
        for (auto s : stex)
            if (s && (!s.Is<SpectrumConstantTexture>() && !s.Is<RGBConstantTexture>() &&
                      !s.Is<RGBReflectanceConstantTexture>() &&
                      !s.Is<GPUSpectrumImageTexture>())) {
                return false;
            }
        return true;
    }